

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<bool_(*)(const_cs::type_id_&,_const_cs::type_id_&),_bool_(*)(const_cs::type_id_&,_const_cs::type_id_&)>
::cni_holder(cni_holder<bool_(*)(const_cs::type_id_&,_const_cs::type_id_&),_bool_(*)(const_cs::type_id_&,_const_cs::type_id_&)>
             *this,_func_bool_type_id_ptr_type_id_ptr **func)

{
  function<bool_(const_cs::type_id_&,_const_cs::type_id_&)> *in_RDI;
  cni_helper<bool_(*)(const_cs::type_id_&,_const_cs::type_id_&),_bool_(*)(const_cs::type_id_&,_const_cs::type_id_&)>
  *this_00;
  function<bool_(const_cs::type_id_&,_const_cs::type_id_&)> *in_stack_ffffffffffffffc0;
  _func_bool_type_id_ptr_type_id_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006bb708;
  this_00 = (cni_helper<bool_(*)(const_cs::type_id_&,_const_cs::type_id_&),_bool_(*)(const_cs::type_id_&,_const_cs::type_id_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<bool(cs::type_id_const&,cs::type_id_const&)>::
  function<bool(*const&)(cs::type_id_const&,cs::type_id_const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<bool_(*)(const_cs::type_id_&,_const_cs::type_id_&),_bool_(*)(const_cs::type_id_&,_const_cs::type_id_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<bool_(const_cs::type_id_&,_const_cs::type_id_&)>::~function
            ((function<bool_(const_cs::type_id_&,_const_cs::type_id_&)> *)0x552936);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}